

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<double>_>::SolveSOR
          (TPZSkylMatrix<std::complex<double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<double>_> *F,TPZFMatrix<std::complex<double>_> *result,
          TPZFMatrix<std::complex<double>_> *residual,TPZFMatrix<std::complex<double>_> *scratch,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  undefined8 uVar1;
  undefined8 uVar2;
  complex<double> **ppcVar3;
  complex<double> *pcVar4;
  int64_t iVar5;
  complex<double> *pcVar6;
  long *in_RCX;
  long lVar7;
  TPZBaseMatrix *in_RDX;
  long *in_RSI;
  long *in_RDI;
  TPZBaseMatrix *in_R8;
  double in_XMM0_Qa;
  double dVar8;
  TPZFMatrix<std::complex<double>_> *extraout_XMM0_Qa;
  TPZFMatrix<std::complex<double>_> *extraout_XMM0_Qa_00;
  TPZSkylMatrix<std::complex<double>_> *extraout_XMM0_Qa_01;
  TPZFMatrix<std::complex<double>_> *pTVar9;
  double *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  complex<double> val_3;
  complex<double> *scratchp_1;
  complex<double> *diaglast_3;
  complex<double> *diag_3;
  int64_t offset_3;
  complex<double> *diaglast_2;
  complex<double> *diag_2;
  complex<double> *p_1;
  complex<double> val_2;
  int64_t offset_2;
  complex<double> *diaglast_1;
  complex<double> *diag_1;
  complex<double> *p;
  complex<double> val_1;
  int64_t offset_1;
  int64_t id;
  int64_t lastid;
  complex<double> *scratchp;
  complex<double> *diaglast;
  complex<double> *diag;
  complex<double> val;
  int64_t offset;
  int64_t ic;
  int64_t it;
  int64_t iinc;
  int64_t ilast;
  int64_t ifirst;
  int64_t i;
  int64_t c;
  int64_t r;
  complex<double> over;
  REAL res;
  complex<double> *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  undefined1 uVar10;
  TPZSkylMatrix<std::complex<double>_> *in_stack_fffffffffffffdf0;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffdf8;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffe00;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffe30;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffe38;
  complex<double> *local_1a0;
  complex<double> *local_178;
  complex<double> *local_108;
  long local_d0;
  complex<double> local_a8;
  int64_t local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  int64_t local_60;
  long local_58;
  complex<double> local_50;
  double local_40;
  double local_38;
  TPZBaseMatrix *local_28;
  long *local_20;
  TPZBaseMatrix *local_18;
  long *local_10;
  
  if (in_R8 == in_RDX) {
    std::operator<<((ostream *)&std::cout,
                    "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
  }
  else {
    local_40 = *in_stack_00000008 + *in_stack_00000008 + 1.0;
    local_38 = in_XMM0_Qa;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    if (in_R8 != (TPZBaseMatrix *)0x0) {
      local_40 = ::Norm((TPZFMatrix<std::complex<double>_> *)
                        CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    }
    if (in_stack_00000010 == 0) {
      (**(code **)(*local_20 + 0x78))();
    }
    pTVar9 = (TPZFMatrix<std::complex<double>_> *)0x0;
    std::complex<double>::complex(&local_50,local_38,0.0);
    local_58 = (**(code **)(*in_RDI + 0x60))();
    local_60 = TPZBaseMatrix::Cols(local_18);
    local_70 = 0;
    local_78 = local_58;
    local_80 = 1;
    if (in_stack_00000018 == -1) {
      local_70 = local_58 + -1;
      local_78 = 0;
      local_80 = -1;
    }
    local_88 = 0;
    while( true ) {
      uVar10 = false;
      if (local_88 < *local_10) {
        uVar10 = *in_stack_00000008 <= local_40 && local_40 != *in_stack_00000008;
      }
      if ((bool)uVar10 == false) break;
      local_40 = 0.0;
      TPZFMatrix<std::complex<double>_>::operator=
                (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      for (local_90 = 0; local_90 < local_60; local_90 = local_90 + 1) {
        if (in_stack_00000018 == 1) {
          for (local_68 = local_70; local_68 != local_78; local_68 = local_80 + local_68) {
            local_98 = Size(in_stack_fffffffffffffdf0,(int64_t)in_RDI);
            pTVar9 = (TPZFMatrix<std::complex<double>_> *)0x0;
            std::complex<double>::complex(&local_a8,0.0,0.0);
            ppcVar3 = TPZVec<std::complex<double>_*>::operator[]
                                ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),local_68);
            pcVar6 = *ppcVar3;
            TPZFMatrix<std::complex<double>_>::operator()
                      (in_stack_fffffffffffffe00,(int64_t)in_stack_fffffffffffffdf8,
                       (int64_t)in_stack_fffffffffffffdf0);
            pcVar4 = TPZFMatrix<std::complex<double>_>::operator()
                               (in_stack_fffffffffffffe00,(int64_t)in_stack_fffffffffffffdf8,
                                (int64_t)in_stack_fffffffffffffdf0);
            local_a8._M_value._0_8_ = *(undefined8 *)pcVar4->_M_value;
            local_a8._M_value._8_8_ = *(undefined8 *)(pcVar4->_M_value + 8);
            ppcVar3 = TPZVec<std::complex<double>_*>::operator[]
                                ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),local_68);
            pcVar4 = *ppcVar3;
            lVar7 = local_98 * 0x10;
            for (local_d0 = 0; local_d0 <= (long)pcVar4 + ((lVar7 + -0x10) - (long)pcVar6) >> 4;
                local_d0 = local_d0 + 1) {
              std::operator*(in_stack_fffffffffffffdd8,(complex<double> *)0x137b7bb);
              std::complex<double>::operator-=
                        ((complex<double> *)CONCAT17(uVar10,in_stack_fffffffffffffde0),
                         in_stack_fffffffffffffdd8);
            }
          }
          for (local_68 = local_70; local_68 != local_78; local_68 = local_80 + local_68) {
            iVar5 = Size(in_stack_fffffffffffffdf0,(int64_t)in_RDI);
            TPZFMatrix<std::complex<double>_>::operator()
                      (in_stack_fffffffffffffe00,(int64_t)in_stack_fffffffffffffdf8,
                       (int64_t)in_stack_fffffffffffffdf0);
            TPZFMatrix<std::complex<double>_>::operator()
                      (in_stack_fffffffffffffe00,(int64_t)in_stack_fffffffffffffdf8,
                       (int64_t)in_stack_fffffffffffffdf0);
            ppcVar3 = TPZVec<std::complex<double>_*>::operator[]
                                ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),local_68);
            local_108 = *ppcVar3 + iVar5;
            ppcVar3 = TPZVec<std::complex<double>_*>::operator[]
                                ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),local_68);
            pcVar6 = *ppcVar3;
            while (local_108 = local_108 + -1, pcVar6 < local_108) {
              std::operator*(in_stack_fffffffffffffdd8,(complex<double> *)0x137b968);
              std::complex<double>::operator-=
                        ((complex<double> *)CONCAT17(uVar10,in_stack_fffffffffffffde0),
                         in_stack_fffffffffffffdd8);
            }
            std::operator*(in_stack_fffffffffffffdd8,(complex<double> *)0x137b9a1);
            dVar8 = std::abs<double>((complex<double> *)CONCAT17(uVar10,in_stack_fffffffffffffde0));
            local_40 = dVar8 + local_40;
            std::operator*(in_stack_fffffffffffffdd8,(complex<double> *)0x137b9e7);
            std::operator/(in_stack_fffffffffffffdd8,(complex<double> *)0x137ba0e);
            TPZFMatrix<std::complex<double>_>::operator()
                      (in_stack_fffffffffffffe00,(int64_t)in_stack_fffffffffffffdf8,
                       (int64_t)in_stack_fffffffffffffdf0);
            std::complex<double>::operator+=
                      ((complex<double> *)CONCAT17(uVar10,in_stack_fffffffffffffde0),
                       in_stack_fffffffffffffdd8);
          }
        }
        else {
          for (local_68 = local_70; local_68 != local_78; local_68 = local_80 + local_68) {
            iVar5 = Size(in_stack_fffffffffffffdf0,(int64_t)in_RDI);
            pcVar6 = TPZFMatrix<std::complex<double>_>::operator()
                               (in_stack_fffffffffffffe00,(int64_t)in_stack_fffffffffffffdf8,
                                (int64_t)in_stack_fffffffffffffdf0);
            uVar1 = *(undefined8 *)pcVar6->_M_value;
            uVar2 = *(undefined8 *)(pcVar6->_M_value + 8);
            TPZFMatrix<std::complex<double>_>::operator()
                      (in_stack_fffffffffffffe00,(int64_t)in_stack_fffffffffffffdf8,
                       (int64_t)in_stack_fffffffffffffdf0);
            ppcVar3 = TPZVec<std::complex<double>_*>::operator[]
                                ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),local_68);
            local_178 = *ppcVar3 + iVar5;
            ppcVar3 = TPZVec<std::complex<double>_*>::operator[]
                                ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),local_68);
            pcVar6 = *ppcVar3;
            while (local_178 = local_178 + -1, pcVar6 < local_178) {
              std::operator*(in_stack_fffffffffffffdd8,(complex<double> *)0x137bbae);
              std::complex<double>::operator-=
                        ((complex<double> *)CONCAT17(uVar10,in_stack_fffffffffffffde0),
                         in_stack_fffffffffffffdd8);
            }
            pcVar6 = TPZFMatrix<std::complex<double>_>::operator()
                               (in_stack_fffffffffffffe00,(int64_t)in_stack_fffffffffffffdf8,
                                (int64_t)in_stack_fffffffffffffdf0);
            *(undefined8 *)pcVar6->_M_value = uVar1;
            *(undefined8 *)(pcVar6->_M_value + 8) = uVar2;
          }
          for (local_68 = local_70; local_68 != local_78; local_68 = local_80 + local_68) {
            iVar5 = Size(in_stack_fffffffffffffdf0,(int64_t)in_RDI);
            ppcVar3 = TPZVec<std::complex<double>_*>::operator[]
                                ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),local_68);
            pcVar6 = *ppcVar3;
            TPZFMatrix<std::complex<double>_>::operator()
                      (in_stack_fffffffffffffe00,(int64_t)in_stack_fffffffffffffdf8,
                       (int64_t)in_stack_fffffffffffffdf0);
            TPZFMatrix<std::complex<double>_>::operator()
                      (in_stack_fffffffffffffe00,(int64_t)in_stack_fffffffffffffdf8,
                       (int64_t)in_stack_fffffffffffffdf0);
            in_stack_fffffffffffffdd8 = pcVar6;
            TPZFMatrix<std::complex<double>_>::operator()
                      (in_stack_fffffffffffffe00,(int64_t)in_stack_fffffffffffffdf8,
                       (int64_t)in_stack_fffffffffffffdf0);
            std::operator*(in_stack_fffffffffffffdd8,(complex<double> *)0x137bd1a);
            in_stack_fffffffffffffe30 = extraout_XMM0_Qa;
            in_stack_fffffffffffffe38 = pTVar9;
            std::complex<double>::operator-=
                      ((complex<double> *)CONCAT17(uVar10,in_stack_fffffffffffffde0),
                       in_stack_fffffffffffffdd8);
            std::operator*(in_stack_fffffffffffffdd8,(complex<double> *)0x137bd42);
            dVar8 = std::abs<double>((complex<double> *)CONCAT17(uVar10,in_stack_fffffffffffffde0));
            local_40 = dVar8 + local_40;
            std::operator*(in_stack_fffffffffffffdd8,(complex<double> *)0x137bd7c);
            in_stack_fffffffffffffe00 = extraout_XMM0_Qa_00;
            std::operator/(in_stack_fffffffffffffdd8,(complex<double> *)0x137bd9a);
            TPZFMatrix<std::complex<double>_>::operator()
                      (in_stack_fffffffffffffe00,(int64_t)in_stack_fffffffffffffdf8,
                       (int64_t)in_stack_fffffffffffffdf0);
            std::complex<double>::operator+=
                      ((complex<double> *)CONCAT17(uVar10,in_stack_fffffffffffffde0),
                       in_stack_fffffffffffffdd8);
            TPZFMatrix<std::complex<double>_>::operator()
                      (in_stack_fffffffffffffe00,(int64_t)in_stack_fffffffffffffdf8,
                       (int64_t)in_stack_fffffffffffffdf0);
            ppcVar3 = TPZVec<std::complex<double>_*>::operator[]
                                ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),local_68);
            local_1a0 = *ppcVar3 + iVar5;
            while (local_1a0 = local_1a0 + -1, pcVar6 < local_1a0) {
              std::operator*(in_stack_fffffffffffffdd8,(complex<double> *)0x137be79);
              in_stack_fffffffffffffdf0 = extraout_XMM0_Qa_01;
              in_stack_fffffffffffffdf8 = pTVar9;
              std::complex<double>::operator-=
                        ((complex<double> *)CONCAT17(uVar10,in_stack_fffffffffffffde0),
                         in_stack_fffffffffffffdd8);
            }
          }
        }
      }
      local_40 = sqrt(local_40);
      local_88 = local_88 + 1;
    }
    if (local_28 != (TPZBaseMatrix *)0x0) {
      (**(code **)(*in_RDI + 0x140))(in_RDI,local_20,local_18,local_28);
    }
    *local_10 = local_88;
    *in_stack_00000008 = local_40;
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SolveSOR(int64_t & numiterations,const TPZFMatrix<TVar> &F,
                                   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch,const REAL overrelax,
                                   REAL &tol,const int FromCurrent,const int direction)  {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	REAL res = 2.*tol+1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
    TVar over = overrelax;
	int64_t r = this->Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	if(direction == -1) {
		ifirst = r-1;
		ilast = 0;
		iinc = -1;
	}
	int64_t it;
	for(it=0; it<numiterations && res > tol; it++) {
		res = 0.;
		scratch = F;
		for(int64_t ic=0; ic<c; ic++) {
			if(direction == 1) {
				//
				// compute the upper triangular part first and put into the scractch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val;
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					int64_t lastid = diag-diaglast;
					int64_t id;
					for(id=0; id<=lastid; id++) *(scratchp+id) -= *(diag-id) * val;
					/* codeguard fix
					 while( diag >= diaglast ) *scratchp++ -= *diag-- * val;
					 */
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					res += abs(val*val);
					result(i,ic) += val*over/ (*diag);
				}
			} else {
				//
				// the direction is upward
				//
				// put the lower triangular part of the multiplication into the scratch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					//					res += val*val;
					scratch(i,ic) = val;
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					//	TVar val = scratch(i,ic);
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					//val= result(i,ic);
					TVar val = scratch(i,ic);
					val -= *diaglast * result(i,ic);
					res += abs(val*val);
					val = over * val / *diaglast;
					result(i,ic) += val;
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					while( diag > diaglast ) *scratchp++ -= *diag-- * val;
				}
			}
		}
		res = sqrt(res);
	}
	if(residual) {
		this->Residual(result,F,*residual);
	}
	numiterations = it;
	tol = res;
}